

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

int add_environment(char *key,char *val)

{
  long lVar1;
  char **ppcVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  char *__s;
  
  lVar3 = 0;
  do {
    if (lVar3 == 0x1f) {
      return 1;
    }
    lVar1 = lVar3 + 1;
    ppcVar2 = ENV + lVar3;
    lVar3 = lVar1;
  } while (*ppcVar2 != (char *)0x0);
  sVar4 = strlen(key);
  sVar5 = strlen(val);
  sVar4 = sVar4 + sVar5 + 2;
  __s = (char *)malloc(sVar4);
  snprintf(__s,sVar4,"%s=%s",key,val);
  *(char **)(lVar1 * 8 + 0x10f918) = __s;
  return 0;
}

Assistant:

int add_environment(const char *key, const char *val)
{
    int n;
 
    for (n = 0; n < 31; n++) {
        if (!ENV[n]) {
            size_t len = strlen(key) + strlen(val) + 2;
            char *entry = malloc(len);
            snprintf(entry, len, "%s=%s", key, val);
            ENV[n] = entry;
            return 0;
        }
    }

    return 1;
}